

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O1

QSizeF __thiscall KDReports::ReportPrivate::paperSize(ReportPrivate *this)

{
  qreal qVar1;
  qreal qVar2;
  qreal in_XMM1_Qa;
  
  if (((this->m_paperSize).wd <= 0.0) || ((this->m_paperSize).ht <= 0.0)) {
    qVar1 = (qreal)QPageSize::size((int)this + 0x28);
    qVar1 = mmToPixels(qVar1);
    qVar2 = mmToPixels(in_XMM1_Qa);
    (this->m_paperSize).wd = qVar1;
    (this->m_paperSize).ht = qVar2;
    if (this->m_orientation == Landscape) {
      QSizeF::transpose();
    }
  }
  return this->m_paperSize;
}

Assistant:

QSizeF KDReports::ReportPrivate::paperSize() const
{
    // determine m_paperSize from m_pageSize if needed
    if (m_paperSize.isEmpty()) {
        const auto mmSize = m_pageSize.size(QPageSize::Millimeter);
        m_paperSize = QSizeF {mmToPixels(mmSize.width()), mmToPixels(mmSize.height())};
        if (m_orientation == QPageLayout::Landscape) {
            m_paperSize.transpose();
        }
    }
    // qDebug() << "m_paperSize=" << m_paperSize;
    return m_paperSize;
}